

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_casts.cpp
# Opt level: O1

BoundCastInfo *
duckdb::DefaultCasts::TimestampCastSwitch
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_50;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_48;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_40;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_38;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_30;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_28;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_20;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_18;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_10;
  
  switch(target->id_) {
  case DATE:
    local_18._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::TemplatedCastLoop<duckdb::timestamp_t,duckdb::date_t,duckdb::Cast>
               ,(unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                 *)&local_18,(init_cast_local_state_t)0x0);
    if (local_18._M_head_impl != (BoundCastData *)0x0) {
      (*(local_18._M_head_impl)->_vptr_BoundCastData[1])();
    }
    break;
  case TIME:
    local_20._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TemplatedCastLoop<duckdb::timestamp_t,duckdb::dtime_t,duckdb::Cast>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_20,(init_cast_local_state_t)0x0);
    if (local_20._M_head_impl != (BoundCastData *)0x0) {
      (*(local_20._M_head_impl)->_vptr_BoundCastData[1])();
    }
    break;
  case TIMESTAMP_SEC:
    local_48._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TemplatedCastLoop<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::CastTimestampUsToSec>
               ,(unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                 *)&local_48,(init_cast_local_state_t)0x0);
    if (local_48._M_head_impl != (BoundCastData *)0x0) {
      (*(local_48._M_head_impl)->_vptr_BoundCastData[1])();
    }
    break;
  case TIMESTAMP_MS:
    local_40._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TemplatedCastLoop<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::CastTimestampUsToMs>
               ,(unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                 *)&local_40,(init_cast_local_state_t)0x0);
    if (local_40._M_head_impl != (BoundCastData *)0x0) {
      (*(local_40._M_head_impl)->_vptr_BoundCastData[1])();
    }
    break;
  default:
    local_50._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,TryVectorNullCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_50,(init_cast_local_state_t)0x0);
    if (local_50._M_head_impl != (BoundCastData *)0x0) {
      (*(local_50._M_head_impl)->_vptr_BoundCastData[1])();
    }
    break;
  case TIMESTAMP_NS:
    local_38._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TemplatedCastLoop<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::CastTimestampUsToNs>
               ,(unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                 *)&local_38,(init_cast_local_state_t)0x0);
    if (local_38._M_head_impl != (BoundCastData *)0x0) {
      (*(local_38._M_head_impl)->_vptr_BoundCastData[1])();
    }
    break;
  case VARCHAR:
    local_10._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::StringCast<duckdb::timestamp_t,duckdb::StringCast>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_10,(init_cast_local_state_t)0x0);
    if (local_10._M_head_impl != (BoundCastData *)0x0) {
      (*(local_10._M_head_impl)->_vptr_BoundCastData[1])();
    }
    break;
  case TIMESTAMP_TZ:
    local_30._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,ReinterpretCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_30,(init_cast_local_state_t)0x0);
    if (local_30._M_head_impl != (BoundCastData *)0x0) {
      (*(local_30._M_head_impl)->_vptr_BoundCastData[1])();
    }
    break;
  case TIME_TZ:
    local_28._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TemplatedCastLoop<duckdb::timestamp_t,duckdb::dtime_tz_t,duckdb::Cast>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_28,(init_cast_local_state_t)0x0);
    if (local_28._M_head_impl != (BoundCastData *)0x0) {
      (*(local_28._M_head_impl)->_vptr_BoundCastData[1])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo DefaultCasts::TimestampCastSwitch(BindCastInput &input, const LogicalType &source,
                                                const LogicalType &target) {
	// now switch on the result type
	switch (target.id()) {
	case LogicalTypeId::VARCHAR:
		// timestamp to varchar
		return BoundCastInfo(&VectorCastHelpers::StringCast<timestamp_t, duckdb::StringCast>);
	case LogicalTypeId::DATE:
		// timestamp to date
		return BoundCastInfo(&VectorCastHelpers::TemplatedCastLoop<timestamp_t, date_t, duckdb::Cast>);
	case LogicalTypeId::TIME:
		// timestamp to time
		return BoundCastInfo(&VectorCastHelpers::TemplatedCastLoop<timestamp_t, dtime_t, duckdb::Cast>);
	case LogicalTypeId::TIME_TZ:
		// timestamp to time_tz
		return BoundCastInfo(&VectorCastHelpers::TemplatedCastLoop<timestamp_t, dtime_tz_t, duckdb::Cast>);
	case LogicalTypeId::TIMESTAMP_TZ:
		// timestamp (us) to timestamp with time zone
		return ReinterpretCast;
	case LogicalTypeId::TIMESTAMP_NS:
		// timestamp (us) to timestamp (ns)
		return BoundCastInfo(
		    &VectorCastHelpers::TemplatedCastLoop<timestamp_t, timestamp_t, duckdb::CastTimestampUsToNs>);
	case LogicalTypeId::TIMESTAMP_MS:
		// timestamp (us) to timestamp (ms)
		return BoundCastInfo(
		    &VectorCastHelpers::TemplatedCastLoop<timestamp_t, timestamp_t, duckdb::CastTimestampUsToMs>);
	case LogicalTypeId::TIMESTAMP_SEC:
		// timestamp (us) to timestamp (s)
		return BoundCastInfo(
		    &VectorCastHelpers::TemplatedCastLoop<timestamp_t, timestamp_t, duckdb::CastTimestampUsToSec>);
	default:
		return TryVectorNullCast;
	}
}